

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,WhileStatement *while_stmt,void *data)

{
  int start_register;
  Instruction i;
  Instruction line;
  pointer pSVar1;
  Function *loop_ast;
  Function *this_00;
  undefined8 in_RSI;
  CodeGenerateVisitor *in_RDI;
  int index;
  Instruction instruction;
  Function *function;
  ExpVarData_conflict exp_var_data;
  int register_id;
  Guard l;
  Guard g;
  undefined8 in_stack_fffffffffffffe68;
  OpType in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  Function *in_stack_fffffffffffffe78;
  JumpType in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  function<void_()> *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  CodeGenerateVisitor *this_01;
  ExpVarData local_11c;
  CodeGenerateVisitor local_108;
  undefined8 local_e0;
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::WhileStatement*,void*)::__0,void>
            ((function<void_()> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffe78);
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::WhileStatement*,void*)::__1,void>
            ((function<void_()> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffe78);
  Guard::Guard((Guard *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88,
               (function<void_()> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  std::function<void_()>::~function((function<void_()> *)0x20734b);
  std::function<void_()>::~function((function<void_()> *)0x207358);
  local_e0 = local_10;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::WhileStatement*,void*)::__2,void>
            ((function<void_()> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (anon_class_16_2_ebea3891 *)in_stack_fffffffffffffe78);
  this_01 = &local_108;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::WhileStatement*,void*)::__3,void>
            ((function<void_()> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffe78);
  Guard::Guard((Guard *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88,
               (function<void_()> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  std::function<void_()>::~function((function<void_()> *)0x2073dc);
  std::function<void_()>::~function((function<void_()> *)0x2073e9);
  start_register = GenerateRegisterId(this_01);
  local_11c._8_4_ = start_register;
  ExpVarData::ExpVarData(&local_11c,start_register,start_register + 1);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x20742c);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,&local_11c);
  loop_ast = GetCurrentFunction(in_RDI);
  i = Instruction::AsBxCode
                (in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                 (int)in_stack_fffffffffffffe68);
  this_00 = (Function *)
            Function::AddInstruction(in_stack_fffffffffffffe78,i,in_stack_fffffffffffffe74);
  AddLoopJumpInfo((CodeGenerateVisitor *)CONCAT44(start_register,in_stack_fffffffffffffe90),
                  (SyntaxTree *)loop_ast,i.opcode_,in_stack_fffffffffffffe80);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x2074df);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,0);
  line = Instruction::AsBxCode
                   (in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                    (int)in_stack_fffffffffffffe68);
  Function::AddInstruction(this_00,i,line.opcode_);
  AddLoopJumpInfo((CodeGenerateVisitor *)CONCAT44(start_register,in_stack_fffffffffffffe90),
                  (SyntaxTree *)loop_ast,i.opcode_,in_stack_fffffffffffffe80);
  Guard::~Guard((Guard *)CONCAT44(line.opcode_,in_stack_fffffffffffffe70));
  Guard::~Guard((Guard *)CONCAT44(line.opcode_,in_stack_fffffffffffffe70));
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(WhileStatement *while_stmt, void *data)
    {
        CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);
        LOOP_GUARD(while_stmt);

        auto register_id = GenerateRegisterId();
        ExpVarData exp_var_data{ register_id, register_id + 1 };
        while_stmt->exp_->Accept(this, &exp_var_data);

        // Jump to loop tail when expression is false
        auto function = GetCurrentFunction();
        auto instruction = Instruction::AsBxCode(OpType_JmpFalse, register_id, 0);
        int index = function->AddInstruction(instruction, while_stmt->first_line_);
        AddLoopJumpInfo(while_stmt, index, LoopJumpInfo::JumpTail);

        while_stmt->block_->Accept(this, nullptr);

        // Jump to loop head
        instruction = Instruction::AsBxCode(OpType_Jmp, 0, 0);
        index = function->AddInstruction(instruction, while_stmt->last_line_);
        AddLoopJumpInfo(while_stmt, index, LoopJumpInfo::JumpHead);
    }